

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

bool __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
::consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
          *i_queue)

{
  ControlBlock *pCVar1;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
  *i_queue_local;
  PrivateType param_1_local;
  consume_operation *this_local;
  
  if (this->m_control != (ControlBlock *)0x0) {
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(this->m_queue,this->m_control);
  }
  this->m_queue = i_queue;
  pCVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(i_queue);
  this->m_control = pCVar1;
  return this->m_control != (ControlBlock *)0x0;
}

Assistant:

bool start_consume_impl(PrivateType, heter_queue * i_queue)
            {
                if (m_control != nullptr)
                {
                    m_queue->cancel_consume_impl(m_control);
                }
                m_queue   = i_queue;
                m_control = i_queue->start_consume_impl();
                return m_control != nullptr;
            }